

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O3

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Aggregate(Relation *this,string *aggregate_list)

{
  ParserOptions options_00;
  element_type *peVar1;
  ClientContext *pCVar2;
  DatabaseInstance *pDVar3;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> sVar4;
  ParserOptions options;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  expression_list;
  undefined1 local_89;
  undefined1 local_88 [24];
  element_type *peStack_70;
  enable_shared_from_this<duckdb::Relation> local_60;
  undefined1 local_50;
  undefined1 uStack_4f;
  undefined6 uStack_4e;
  idx_t iStack_48;
  vector<duckdb::ParserExtension,_true> *local_40;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_38;
  
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)((long)&aggregate_list->field_2 + 8))
  ;
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_88);
  pCVar2 = shared_ptr<duckdb::ClientContext,_true>::operator->
                     ((shared_ptr<duckdb::ClientContext,_true> *)local_88);
  local_50 = (pCVar2->config).preserve_identifier_case;
  uStack_4f = (pCVar2->config).integer_division;
  iStack_48 = (pCVar2->config).max_expression_depth;
  pDVar3 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&pCVar2->db);
  local_40 = &(pDVar3->config).parser_extensions;
  options_00.integer_division = (bool)uStack_4f;
  options_00.preserve_identifier_case = (bool)local_50;
  options_00._2_6_ = uStack_4e;
  options_00.max_expression_depth = iStack_48;
  options_00.extensions = local_40;
  Parser::ParseExpressionList
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_38,in_RDX,options_00);
  if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_60);
  local_88._0_8_ = (AggregateRelation *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::AggregateRelation,std::allocator<duckdb::AggregateRelation>,duckdb::shared_ptr<duckdb::Relation,true>,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
             (AggregateRelation **)local_88,(allocator<duckdb::AggregateRelation> *)&local_89,
             (shared_ptr<duckdb::Relation,_true> *)&local_60,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_38);
  shared_ptr<duckdb::AggregateRelation,_true>::shared_ptr
            ((shared_ptr<duckdb::AggregateRelation,_true> *)(local_88 + 0x10),
             (shared_ptr<duckdb::AggregateRelation> *)local_88);
  if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  peVar1 = peStack_70;
  peStack_70 = (element_type *)0x0;
  this->_vptr_Relation = (_func_int **)local_88._16_8_;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_88._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_60.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.__weak_this_.internal.
               super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_38);
  sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::Aggregate(const string &aggregate_list) {
	auto expression_list = Parser::ParseExpressionList(aggregate_list, context->GetContext()->GetParserOptions());
	return make_shared_ptr<AggregateRelation>(shared_from_this(), std::move(expression_list));
}